

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::getBestAppending
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          int32_t missingFields,int32_t flags,UErrorCode *status,
          UDateTimePatternMatchOptions options)

{
  UErrorCode *errorCode;
  UDateTimePatternField field;
  UnicodeString *pUVar1;
  int iVar2;
  uint uVar3;
  uint includeMask;
  long lVar4;
  DateTimePatternGenerator *this_00;
  DistanceInfo *missingFields_00;
  PtnSkeleton *specifiedSkeleton;
  UErrorCode *local_180;
  UObject local_178;
  uint local_170;
  uint local_16c;
  undefined1 *local_168;
  UnicodeString *local_160;
  UnicodeString *values [3];
  UnicodeString resultPattern;
  UnicodeString tempPattern;
  undefined1 local_b8 [72];
  UnicodeString appendName;
  
  if (U_ZERO_ERROR < *status) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00471e80;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    return __return_storage_ptr__;
  }
  resultPattern.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_00471e80;
  resultPattern.fUnion.fStackFields.fLengthAndFlags = 2;
  tempPattern.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  tempPattern.fUnion.fStackFields.fLengthAndFlags = 2;
  if (missingFields != 0) {
    local_178._vptr_UObject = (_func_int **)&PTR__UnicodeString_00471e80;
    local_b8._0_8_ = &PTR__UnicodeString_00471e80;
    local_b8._8_2_ = 2;
    icu_63::UnicodeString::moveFrom(&resultPattern,(UnicodeString *)local_b8);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
    specifiedSkeleton = (PtnSkeleton *)0x0;
    pUVar1 = getBestRaw(this,this->dtMatcher,missingFields,this->distanceInfo,status,
                        &specifiedSkeleton);
    if (U_ZERO_ERROR < *status) {
LAB_002d6007:
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           local_178._vptr_UObject;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      goto LAB_002d62bd;
    }
    icu_63::UnicodeString::operator=(&tempPattern,pUVar1);
    adjustFieldTypes((UnicodeString *)local_b8,this,&tempPattern,specifiedSkeleton,flags,options);
    icu_63::UnicodeString::moveFrom(&resultPattern,(UnicodeString *)local_b8);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
    missingFields_00 = this->distanceInfo;
    if (missingFields_00->missingFieldMask != 0) {
      local_16c = missingFields & 0x6000;
      local_170 = flags | 1;
      local_168 = &this->field_0x108;
      includeMask = missingFields_00->missingFieldMask;
      local_180 = status;
      local_160 = __return_storage_ptr__;
      uVar3 = 0;
      while ((__return_storage_ptr__ = local_160, includeMask != 0 && (uVar3 != includeMask))) {
        if ((local_16c == 0x6000) && ((includeMask & 0x6000) == 0x4000)) {
          adjustFieldTypes((UnicodeString *)local_b8,this,&resultPattern,specifiedSkeleton,local_170
                           ,options);
          icu_63::UnicodeString::moveFrom(&resultPattern,(UnicodeString *)local_b8);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
          missingFields_00 = this->distanceInfo;
          includeMask = missingFields_00->missingFieldMask & 0xffffbfff;
          missingFields_00->missingFieldMask = includeMask;
        }
        else {
          pUVar1 = getBestRaw(this,this->dtMatcher,includeMask,missingFields_00,local_180,
                              &specifiedSkeleton);
          __return_storage_ptr__ = local_160;
          if (U_ZERO_ERROR < *local_180) goto LAB_002d6007;
          icu_63::UnicodeString::operator=(&tempPattern,pUVar1);
          adjustFieldTypes((UnicodeString *)local_b8,this,&tempPattern,specifiedSkeleton,flags,
                           options);
          icu_63::UnicodeString::moveFrom(&tempPattern,(UnicodeString *)local_b8);
          this_00 = (DateTimePatternGenerator *)local_b8;
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
          missingFields_00 = this->distanceInfo;
          uVar3 = missingFields_00->missingFieldMask;
          field = getTopBitNumber(this_00,includeMask & ~uVar3);
          lVar4 = (long)(int)field * 0x40;
          if (*(short *)(local_168 + lVar4 + 8) < 0) {
            iVar2 = *(int *)(local_168 + lVar4 + 0xc);
          }
          else {
            iVar2 = (int)*(short *)(local_168 + lVar4 + 8) >> 5;
          }
          includeMask = uVar3;
          if (iVar2 != 0) {
            appendName.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)(UObject)local_178._vptr_UObject;
            appendName.fUnion.fStackFields.fLengthAndFlags = 2;
            getAppendName(this,field,&appendName);
            errorCode = local_180;
            values[1] = &tempPattern;
            values[0] = &resultPattern;
            values[2] = &appendName;
            SimpleFormatter::SimpleFormatter
                      ((SimpleFormatter *)local_b8,(UnicodeString *)(local_168 + lVar4),2,3,
                       local_180);
            SimpleFormatter::formatAndReplace
                      ((SimpleFormatter *)local_b8,values,3,&resultPattern,(int32_t *)0x0,0,
                       errorCode);
            SimpleFormatter::~SimpleFormatter((SimpleFormatter *)local_b8);
            icu_63::UnicodeString::~UnicodeString(&appendName);
            missingFields_00 = this->distanceInfo;
            includeMask = missingFields_00->missingFieldMask;
            uVar3 = includeMask;
          }
        }
      }
    }
  }
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&resultPattern);
LAB_002d62bd:
  icu_63::UnicodeString::~UnicodeString(&tempPattern);
  icu_63::UnicodeString::~UnicodeString(&resultPattern);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::getBestAppending(int32_t missingFields, int32_t flags, UErrorCode &status, UDateTimePatternMatchOptions options) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString  resultPattern, tempPattern;
    const UnicodeString* tempPatternPtr;
    int32_t lastMissingFieldMask=0;
    if (missingFields!=0) {
        resultPattern=UnicodeString();
        const PtnSkeleton* specifiedSkeleton=nullptr;
        tempPatternPtr = getBestRaw(*dtMatcher, missingFields, distanceInfo, status, &specifiedSkeleton);
        if (U_FAILURE(status)) {
            return UnicodeString();
        }
        tempPattern = *tempPatternPtr;
        resultPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
        if ( distanceInfo->missingFieldMask==0 ) {
            return resultPattern;
        }
        while (distanceInfo->missingFieldMask!=0) { // precondition: EVERY single field must work!
            if ( lastMissingFieldMask == distanceInfo->missingFieldMask ) {
                break;  // cannot find the proper missing field
            }
            if (((distanceInfo->missingFieldMask & UDATPG_SECOND_AND_FRACTIONAL_MASK)==UDATPG_FRACTIONAL_MASK) &&
                ((missingFields & UDATPG_SECOND_AND_FRACTIONAL_MASK) == UDATPG_SECOND_AND_FRACTIONAL_MASK)) {
                resultPattern = adjustFieldTypes(resultPattern, specifiedSkeleton, flags | kDTPGFixFractionalSeconds, options);
                distanceInfo->missingFieldMask &= ~UDATPG_FRACTIONAL_MASK;
                continue;
            }
            int32_t startingMask = distanceInfo->missingFieldMask;
            tempPatternPtr = getBestRaw(*dtMatcher, distanceInfo->missingFieldMask, distanceInfo, status, &specifiedSkeleton);
            if (U_FAILURE(status)) {
                return UnicodeString();
            }
            tempPattern = *tempPatternPtr;
            tempPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
            int32_t foundMask=startingMask& ~distanceInfo->missingFieldMask;
            int32_t topField=getTopBitNumber(foundMask);

            if (appendItemFormats[topField].length() != 0) {
                UnicodeString appendName;
                getAppendName((UDateTimePatternField)topField, appendName);
                const UnicodeString *values[3] = {
                    &resultPattern,
                    &tempPattern,
                    &appendName
                };
                SimpleFormatter(appendItemFormats[topField], 2, 3, status).
                    formatAndReplace(values, 3, resultPattern, nullptr, 0, status);
            }
            lastMissingFieldMask = distanceInfo->missingFieldMask;
        }
    }
    return resultPattern;
}